

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::createSpecConstantOp
          (Builder *this,Op opCode,Id typeId,Vector<Id> *operands,Vector<unsigned_int> *literals)

{
  vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *this_00;
  iterator iVar1;
  Builder *pBVar2;
  Id IVar3;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> instruction;
  uint *puVar4;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40;
  Builder *local_38;
  
  instruction.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       ::dxil_spv::allocate_in_thread(0x38);
  IVar3 = this->uniqueId + 1;
  this->uniqueId = IVar3;
  *(undefined ***)
   instruction.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001f81e0;
  *(Id *)((long)instruction.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar3;
  *(Id *)((long)instruction.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = typeId;
  *(Op *)((long)instruction.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) =
       OpSpecConstantOp;
  this_00 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
            ((long)instruction.
                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18);
  (((Vector<Id> *)
   ((long)instruction.
          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
          super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)instruction.
          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
          super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
  *(pointer *)
   ((long)instruction.
          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
          super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
  *(Block **)
   ((long)instruction.
          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
          super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = (Block *)0x0;
  local_40._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = opCode;
  iVar1._M_current =
       *(pointer *)
        ((long)instruction.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
  local_38 = this;
  if (iVar1._M_current ==
      *(pointer *)
       ((long)instruction.
              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
              super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>(this_00,iVar1,(uint *)&local_40);
  }
  else {
    *iVar1._M_current = opCode;
    *(uint **)((long)instruction.
                     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                     .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
         iVar1._M_current + 1;
  }
  puVar4 = (operands->
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (operands->
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_40._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = *puVar4;
      iVar1._M_current =
           *(pointer *)
            ((long)instruction.
                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
      if (iVar1._M_current ==
          *(pointer *)
           ((long)instruction.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(this_00,iVar1,(uint *)&local_40);
      }
      else {
        *iVar1._M_current = *puVar4;
        *(uint **)((long)instruction.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar1._M_current + 1;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != (operands->
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  puVar4 = (literals->
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (literals->
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_40._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = *puVar4;
      iVar1._M_current =
           *(pointer *)
            ((long)instruction.
                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
      if (iVar1._M_current ==
          *(pointer *)
           ((long)instruction.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(this_00,iVar1,(uint *)&local_40);
      }
      else {
        *iVar1._M_current = *puVar4;
        *(uint **)((long)instruction.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar1._M_current + 1;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != (literals->
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  pBVar2 = local_38;
  Module::mapInstruction
            (&local_38->module,
             (Instruction *)
             instruction.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  local_40._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       instruction.
       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar2->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
  if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
      local_40._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
    (**(code **)(*(long *)local_40._M_t.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
  }
  return *(Id *)((long)instruction.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
}

Assistant:

Id Builder::createSpecConstantOp(Op opCode, Id typeId, const dxil_spv::Vector<Id>& operands, const dxil_spv::Vector<unsigned>& literals)
{
    Instruction* op = new Instruction(getUniqueId(), typeId, OpSpecConstantOp);
    op->addImmediateOperand((unsigned) opCode);
    for (auto it = operands.cbegin(); it != operands.cend(); ++it)
        op->addIdOperand(*it);
    for (auto it = literals.cbegin(); it != literals.cend(); ++it)
        op->addImmediateOperand(*it);
    module.mapInstruction(op);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}